

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

CRuntimeFunctionPtr __thiscall
Refal2::CGlobalFunctionData::RuntimeFunction(CGlobalFunctionData *this,CProgramPtr *program)

{
  bool bVar1;
  TRuntimeModuleId _runtimeModuleId;
  CEmbeddedFunction *this_00;
  CPreparatoryFunction *pCVar2;
  COrdinaryFunction *this_01;
  TOperationAddress _firstOperation;
  __shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CRuntimeFunctionPtr CVar3;
  undefined1 local_40 [40];
  CProgramPtr *program_local;
  CGlobalFunctionData *this_local;
  
  local_40._32_8_ = in_RDX;
  program_local = program;
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (!bVar1) {
    bVar1 = IsEmbeddedFunction((CGlobalFunctionData *)program);
    if (bVar1) {
      this_00 = (CEmbeddedFunction *)operator_new(0x10);
      CEmbeddedFunction::CEmbeddedFunction
                (this_00,(TEmbeddedFunctionPtr)
                         (program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_refcount._M_pi);
      std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
      reset<Refal2::CEmbeddedFunction>
                ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)
                 &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_00);
    }
    else {
      bVar1 = IsPreparatoryFunction((CGlobalFunctionData *)program);
      if (!bVar1) {
        __assert_fail("IsPreparatoryFunction()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                      ,0x8e,
                      "CRuntimeFunctionPtr Refal2::CGlobalFunctionData::RuntimeFunction(const CProgramPtr &) const"
                     );
      }
      pCVar2 = PreparatoryFunction((CGlobalFunctionData *)program);
      bVar1 = CPreparatoryFunction::IsEmpty(pCVar2);
      if (bVar1) {
        std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_40._32_8_);
        CProgram::EmptyFunction((CProgram *)local_40);
        std::shared_ptr<Refal2::CRuntimeFunction>::operator=
                  ((shared_ptr<Refal2::CRuntimeFunction> *)
                   &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(shared_ptr<Refal2::CRuntimeFunction> *)local_40);
        std::shared_ptr<Refal2::CRuntimeFunction>::~shared_ptr
                  ((shared_ptr<Refal2::CRuntimeFunction> *)local_40);
      }
      else {
        this_01 = (COrdinaryFunction *)operator_new(0x18);
        pCVar2 = PreparatoryFunction((CGlobalFunctionData *)program);
        _firstOperation = CPreparatoryFunction::FirstOperation(pCVar2);
        _runtimeModuleId = RuntimeModuleId((CGlobalFunctionData *)program);
        COrdinaryFunction::COrdinaryFunction(this_01,_firstOperation,_runtimeModuleId);
        std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
        reset<Refal2::COrdinaryFunction>
                  ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)
                   &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,this_01);
      }
    }
  }
  std::shared_ptr<Refal2::CRuntimeFunction>::shared_ptr
            ((shared_ptr<Refal2::CRuntimeFunction> *)this,
             (shared_ptr<Refal2::CRuntimeFunction> *)
             &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CVar3.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CRuntimeFunctionPtr)
         CVar3.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CRuntimeFunctionPtr CGlobalFunctionData::RuntimeFunction(
	const CProgramPtr& program ) const
{
	if( !static_cast<bool>( runtimeFunction ) ) {
		if( IsEmbeddedFunction() ) {
			runtimeFunction.reset( new CEmbeddedFunction(
				embeddedFunction ) );
		} else {
			assert( IsPreparatoryFunction() );
			if( PreparatoryFunction()->IsEmpty() ) {
				runtimeFunction = program->EmptyFunction();
			} else {
				runtimeFunction.reset( new COrdinaryFunction(
					PreparatoryFunction()->FirstOperation(),
					RuntimeModuleId() ) );
			}
		}
	}
	return runtimeFunction;
}